

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::QuadrantRendederCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  ostream *poVar2;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream buf;
  char *versionDecl;
  QuadrantRendederCase *this_local;
  
  pcVar1 = glu::getGLSLVersionDeclaration(*(GLSLVersion *)((long)this + 0x70));
  std::__cxx11::ostringstream::ostringstream(local_198);
  if ((*(uint *)((long)this + 0x78) & 0x10) == 0) {
    if (*(int *)((long)this + 0x78) == 0) {
      poVar2 = std::operator<<((ostream *)local_198,pcVar1);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"layout(location = 1) flat in highp int frag_quadrant_id;\n");
      poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 o_color;\n");
      poVar2 = std::operator<<(poVar2,"void main (void)\n");
      poVar2 = std::operator<<(poVar2,"{\n");
      poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = frag_quadrant_id;\n");
      poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
      (**(code **)(*this + 0x50))(local_228);
      poVar2 = std::operator<<(poVar2,local_228);
      poVar2 = std::operator<<(poVar2,"\to_color = result_color;\n");
      std::operator<<(poVar2,"}\n");
      std::__cxx11::string::~string(local_228);
    }
    else {
      poVar2 = std::operator<<((ostream *)local_198,pcVar1);
      poVar2 = std::operator<<(poVar2,"\n");
      std::operator<<(poVar2,
                      "layout(location = 0) in mediump vec4 frag_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = frag_color;\n}\n"
                     );
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)local_198,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    (**(code **)(*this + 0x38))(local_1c8,this,8);
    poVar2 = std::operator<<(poVar2,local_1c8);
    (**(code **)(*this + 0x40))(local_1e8,this,0x10,0);
    std::operator<<(poVar2,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1c8);
    if (*(int *)((long)this + 0x78) != 0x10) {
      std::operator<<((ostream *)local_198,"layout(location = 0) in mediump vec4 frag_color;\n");
    }
    poVar2 = std::operator<<((ostream *)local_198,
                             "layout(location = 1) flat in highp int frag_quadrant_id;\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 o_color;\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = frag_quadrant_id;\n");
    poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
    (**(code **)(*this + 0x48))(local_208,this,0x10);
    std::operator<<(poVar2,local_208);
    std::__cxx11::string::~string(local_208);
    if (*(int *)((long)this + 0x78) == 0x10) {
      std::operator<<((ostream *)local_198,"\to_color = result_color;\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_198,"\tif (frag_quadrant_id < 2)\n");
      poVar2 = std::operator<<(poVar2,"\t\to_color = result_color;\n");
      poVar2 = std::operator<<(poVar2,"\telse\n");
      std::operator<<(poVar2,"\t\to_color = frag_color;\n");
    }
    std::operator<<((ostream *)local_198,"}\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string QuadrantRendederCase::genFragmentSource (void) const
{
	const char* const	versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	std::ostringstream	buf;

	if ((m_activeStages & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0u)
	{
		buf << versionDecl << "\n"
			<< genExtensionDeclarations(vk::VK_SHADER_STAGE_GEOMETRY_BIT)
			<< genResourceDeclarations(vk::VK_SHADER_STAGE_FRAGMENT_BIT, 0);

		if (m_activeStages != vk::VK_SHADER_STAGE_FRAGMENT_BIT)
		{
			// there are other stages, this is just a contributor
			buf << "layout(location = 0) in mediump vec4 frag_color;\n";
		}

		buf << "layout(location = 1) flat in highp int frag_quadrant_id;\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	highp int quadrant_id = frag_quadrant_id;\n"
			<< "	highp vec4 result_color;\n"
			<< genResourceAccessSource(vk::VK_SHADER_STAGE_FRAGMENT_BIT);

		if (m_activeStages != vk::VK_SHADER_STAGE_FRAGMENT_BIT)
		{
			// just contributor
			buf	<< "	if (frag_quadrant_id < 2)\n"
				<< "		o_color = result_color;\n"
				<< "	else\n"
				<< "		o_color = frag_color;\n";
		}
		else
			buf << "	o_color = result_color;\n";

		buf << "}\n";
	}
	else if (m_activeStages == 0u)
	{
		// special case, no active stages
		buf << versionDecl << "\n"
			<< "layout(location = 1) flat in highp int frag_quadrant_id;\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	highp int quadrant_id = frag_quadrant_id;\n"
			<< "	highp vec4 result_color;\n"
			<< genNoAccessSource()
			<< "	o_color = result_color;\n"
			<< "}\n";
	}
	else
	{
		// passthrough
		buf <<	versionDecl << "\n"
			<<	"layout(location = 0) in mediump vec4 frag_color;\n"
				"layout(location = 0) out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	o_color = frag_color;\n"
				"}\n";
	}

	return buf.str();
}